

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_impl.hpp
# Opt level: O2

ComponentType dxil_spv::raw_width_to_component_type(RawType type,RawWidth raw_width)

{
  if (raw_width == B8) {
    return InternalU8;
  }
  if (raw_width != B64) {
    if (raw_width == B16) {
      return (type == Float) * '\x05' + U16;
    }
    return (type == Float) * '\x04' + U32;
  }
  return (type == Float) * '\x03' + U64;
}

Assistant:

static inline DXIL::ComponentType raw_width_to_component_type(RawType type, RawWidth raw_width)
{
	switch (raw_width)
	{
	case RawWidth::B8:
		return DXIL::ComponentType::InternalU8;
	case RawWidth::B16:
		return type == RawType::Float ? DXIL::ComponentType::F16 : DXIL::ComponentType::U16;
	case RawWidth::B64:
		return type == RawType::Float ? DXIL::ComponentType::F64 : DXIL::ComponentType::U64;
	default:
		return type == RawType::Float ? DXIL::ComponentType::F32 : DXIL::ComponentType::U32;
	}
}